

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

int __thiscall QDockWidgetLayout::titleHeight(QDockWidgetLayout *this)

{
  int iVar1;
  int iVar2;
  QDockWidget *pQVar3;
  QWidget *pQVar4;
  const_reference ppQVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar6;
  QStyle *pQVar7;
  long in_RDI;
  long in_FS_OFFSET;
  int mw;
  int buttonHeight;
  QLayoutItem *item_1;
  QLayoutItem *item;
  QWidget *title;
  QDockWidget *q;
  QFontMetrics titleFontMetrics;
  QSize floatSize;
  QSize closeSize;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 uVar8;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_4c;
  int local_48;
  int local_44;
  undefined1 *local_40;
  int local_38;
  int local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget((QLayout *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  pQVar3 = qobject_cast<QDockWidget*>((QObject *)0x58b248);
  pQVar4 = widgetForRole((QDockWidgetLayout *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (Role)((ulong)in_RDI >> 0x20));
  if (pQVar4 == (QWidget *)0x0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    ppQVar5 = QList<QLayoutItem_*>::operator[]
                        ((QList<QLayoutItem_*> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (*ppQVar5 != (QLayoutItem *)0x0) {
      iVar1 = (*(*ppQVar5)->_vptr_QLayoutItem[0xd])();
      local_28 = (undefined1 *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x70))();
      local_18 = local_28;
    }
    ppQVar5 = QList<QLayoutItem_*>::operator[]
                        ((QList<QLayoutItem_*> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    uVar8 = (undefined1)((uint)in_stack_ffffffffffffff74 >> 0x18);
    if (*ppQVar5 != (QLayoutItem *)0x0) {
      iVar1 = (*(*ppQVar5)->_vptr_QLayoutItem[0xd])();
      local_30 = (undefined1 *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x70))();
      local_20 = local_30;
    }
    local_34 = perp((bool)uVar8,
                    (QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_38 = perp((bool)uVar8,
                    (QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    piVar6 = qMax<int>(&local_34,&local_38);
    iVar1 = *piVar6;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                           );
    iVar2 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x46,0,pQVar3);
    local_44 = iVar1 + 2;
    local_48 = QFontMetrics::height();
    local_48 = local_48 + iVar2 * 2;
    piVar6 = qMax<int>(&local_44,&local_48);
    local_4c = *piVar6;
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_40);
  }
  else {
    uVar8 = *(undefined1 *)(in_RDI + 0x1c);
    local_10 = (**(code **)(*(long *)pQVar4 + 0x70))();
    local_4c = perp((bool)uVar8,
                    (QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_4c;
  }
  __stack_chk_fail();
}

Assistant:

int QDockWidgetLayout::titleHeight() const
{
    QDockWidget *q = qobject_cast<QDockWidget*>(parentWidget());

    if (QWidget *title = widgetForRole(TitleBar))
        return perp(verticalTitleBar, title->sizeHint());

    QSize closeSize(0, 0);
    QSize floatSize(0, 0);
    if (QLayoutItem *item = item_list[CloseButton])
        closeSize = item->widget()->sizeHint();
    if (QLayoutItem *item = item_list[FloatButton])
        floatSize = item->widget()->sizeHint();

    int buttonHeight = qMax(perp(verticalTitleBar, closeSize),
                            perp(verticalTitleBar, floatSize));

    QFontMetrics titleFontMetrics = q->fontMetrics();
    int mw = q->style()->pixelMetric(QStyle::PM_DockWidgetTitleMargin, nullptr, q);

    return qMax(buttonHeight + 2, titleFontMetrics.height() + 2*mw);
}